

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O1

void __thiscall QTreeView::updateGeometries(QTreeView *this)

{
  int iVar1;
  QTreeViewPrivate *this_00;
  QWidget *this_01;
  QWidgetData *pQVar2;
  QSize QVar3;
  int extraout_var;
  Representation top;
  long in_FS_OFFSET;
  QRect local_58;
  void *local_48;
  char *pcStack_40;
  QMetaTypeInterface *local_38 [2];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QTreeViewPrivate **)
             &(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget.
              field_0x8;
  this_01 = (QWidget *)this_00->header;
  if (this_01 != (QWidget *)0x0) {
    if (this_00->geometryRecursionBlock != false) goto LAB_005b3bbb;
    this_00->geometryRecursionBlock = true;
    top.m_i = 0;
    if ((this_01->data->widget_attributes & 0x10000) == 0) {
      QVar3 = QWidget::minimumSize(this_01);
      (**(code **)(*(long *)&(this_00->header->super_QAbstractItemView).super_QAbstractScrollArea.
                             super_QFrame.super_QWidget + 0x70))();
      top.m_i = extraout_var;
      if (extraout_var < QVar3.ht.m_i.m_i) {
        top.m_i = QVar3.ht.m_i.m_i;
      }
      QVar3 = QWidget::maximumSize((QWidget *)this_00->header);
      if (QVar3.ht.m_i.m_i <= top.m_i) {
        top.m_i = QVar3.ht.m_i.m_i;
      }
    }
    QAbstractScrollArea::setViewportMargins((QAbstractScrollArea *)this,0,top.m_i,0,0);
    pQVar2 = ((this_00->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.viewport)->
             data;
    iVar1 = (pQVar2->crect).y1.m_i;
    local_58.y1.m_i = iVar1 - top.m_i;
    local_58.x1.m_i = (pQVar2->crect).x1.m_i;
    local_58.y2.m_i = iVar1 + -1;
    local_58.x2.m_i = (pQVar2->crect).x2.m_i;
    QWidget::setGeometry((QWidget *)this_00->header,&local_58);
    local_48 = (void *)0x0;
    pcStack_40 = (char *)0x0;
    local_38[0] = (QMetaTypeInterface *)0x0;
    QMetaObject::invokeMethodImpl
              ((QObject *)this_00->header,"updateGeometries",AutoConnection,1,&local_48,&pcStack_40,
               local_38);
    QTreeViewPrivate::updateScrollBars(this_00);
    this_00->geometryRecursionBlock = false;
  }
  QAbstractItemView::updateGeometries((QAbstractItemView *)this);
LAB_005b3bbb:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTreeView::updateGeometries()
{
    Q_D(QTreeView);
    if (d->header) {
        if (d->geometryRecursionBlock)
            return;
        d->geometryRecursionBlock = true;
        int height = 0;
        if (!d->header->isHidden()) {
            height = qMax(d->header->minimumHeight(), d->header->sizeHint().height());
            height = qMin(height, d->header->maximumHeight());
        }
        setViewportMargins(0, height, 0, 0);
        QRect vg = d->viewport->geometry();
        QRect geometryRect(vg.left(), vg.top() - height, vg.width(), height);
        d->header->setGeometry(geometryRect);
        QMetaObject::invokeMethod(d->header, "updateGeometries");
        d->updateScrollBars();
        d->geometryRecursionBlock = false;
    }
    QAbstractItemView::updateGeometries();
}